

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_constant_aggregator.cpp
# Opt level: O2

void __thiscall
duckdb::WindowConstantAggregatorLocalState::Sink
          (WindowConstantAggregatorLocalState *this,DataChunk *sink_chunk,DataChunk *coll_chunk,
          idx_t row,optional_ptr<duckdb::SelectionVector,_true> filter_sel,idx_t filtered)

{
  DataChunk *this_00;
  DataChunk *chunk;
  WindowConstantAggregatorGlobalState *pWVar1;
  data_ptr_t pdVar2;
  WindowAggregator *pWVar3;
  sel_t *psVar4;
  aggregate_simple_update_t p_Var5;
  Vector *pVVar6;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var7;
  size_type __n;
  data_ptr_t *ppdVar8;
  reference pvVar9;
  const_reference pvVar10;
  reference pvVar11;
  ulong uVar12;
  SelectionVector *pSVar13;
  ulong uVar14;
  idx_t iVar15;
  idx_t count_p;
  ulong end;
  idx_t c_1;
  idx_t iVar16;
  idx_t iVar17;
  ulong offset;
  column_t c;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  optional_ptr<duckdb::SelectionVector,_true> filter_sel_local;
  long local_b8;
  idx_t row_local;
  SelectionVector sel;
  AggregateInputData aggr_input_data;
  
  pWVar1 = this->gstate;
  iVar17 = sink_chunk->count;
  filter_sel_local = filter_sel;
  _Var7 = ::std::
          __upper_bound<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long,__gnu_cxx::__ops::_Val_less_iter>
                    ((pWVar1->partition_offsets).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (pWVar1->partition_offsets).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __n = (long)_Var7._M_current -
        (long)(pWVar1->partition_offsets).
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3;
  ppdVar8 = WindowAggregateStates::GetData(&this->statef);
  pdVar2 = (this->statep).data;
  pWVar3 = (this->gstate->super_WindowAggregatorGlobalState).aggregator;
  chunk = &this->payload_chunk;
  for (uVar18 = 0;
      uVar18 < (ulong)((long)(pWVar3->child_idx).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pWVar3->child_idx).
                             super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3); uVar18 = uVar18 + 1) {
    pvVar9 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar18);
    pvVar10 = vector<unsigned_long,_true>::get<true>(&pWVar3->child_idx,uVar18);
    pvVar11 = vector<duckdb::Vector,_true>::get<true>(&sink_chunk->data,*pvVar10);
    Vector::Reference(pvVar9,pvVar11);
  }
  uVar12 = iVar17 + row;
  local_b8 = __n - 1;
  aggr_input_data.bind_data.ptr =
       AggregateObject::GetFunctionData(&(pWVar1->super_WindowAggregatorGlobalState).aggr);
  aggr_input_data.allocator =
       &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
  aggr_input_data.combine_type = PRESERVE_INPUT;
  pvVar10 = vector<unsigned_long,_true>::get<true>(&pWVar1->partition_offsets,__n);
  uVar18 = *pvVar10;
  this_00 = &this->inputs;
  uVar19 = 0;
  offset = 0;
  row_local = row;
  do {
    if (uVar12 <= row_local) {
      return;
    }
    if (row_local == uVar18) {
      pvVar10 = vector<unsigned_long,_true>::get<true>(&pWVar1->partition_offsets,local_b8 + 2);
      uVar18 = *pvVar10;
      local_b8 = local_b8 + 1;
    }
    if (uVar12 <= uVar18) {
      uVar18 = uVar12;
    }
    end = uVar18 - row;
    DataChunk::Reset(this_00);
    if (filter_sel_local.ptr == (SelectionVector *)0x0) {
      if (offset == 0) {
        DataChunk::Reference(this_00,chunk);
      }
      else {
        for (uVar20 = 0;
            uVar20 < (ulong)(((long)(this->payload_chunk).data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->payload_chunk).data.
                                   super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                   super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x68);
            uVar20 = uVar20 + 1) {
          pvVar9 = vector<duckdb::Vector,_true>::get<true>(&this_00->data,uVar20);
          pvVar11 = vector<duckdb::Vector,_true>::get<true>(&chunk->data,uVar20);
          Vector::Slice(pvVar9,pvVar11,offset,end);
        }
      }
      iVar17 = end - offset;
      (this->inputs).count = iVar17;
    }
    else {
      sel.sel_vector = (sel_t *)0x0;
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      iVar17 = filtered;
      if (filtered < uVar19) {
        iVar17 = uVar19;
      }
      for (; uVar20 = iVar17, iVar17 != uVar19; uVar19 = uVar19 + 1) {
        pSVar13 = optional_ptr<duckdb::SelectionVector,_true>::operator->(&filter_sel_local);
        uVar14 = uVar19;
        if (pSVar13->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)pSVar13->sel_vector[uVar19];
        }
        uVar20 = uVar19;
        if (offset <= uVar14) break;
      }
      pSVar13 = optional_ptr<duckdb::SelectionVector,_true>::operator->(&filter_sel_local);
      psVar4 = pSVar13->sel_vector;
      ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
                 &sel.selection_data);
      iVar17 = filtered;
      if (filtered < uVar20) {
        iVar17 = uVar20;
      }
      iVar15 = iVar17 - uVar20;
      iVar16 = 0;
      sel.sel_vector = psVar4 + uVar20;
      for (; count_p = iVar15, uVar19 = iVar17, iVar17 != uVar20; uVar20 = uVar20 + 1) {
        pSVar13 = optional_ptr<duckdb::SelectionVector,_true>::operator->(&filter_sel_local);
        uVar14 = uVar20;
        if (pSVar13->sel_vector != (sel_t *)0x0) {
          uVar14 = (ulong)pSVar13->sel_vector[uVar20];
        }
        count_p = iVar16;
        uVar19 = uVar20;
        if (end <= uVar14) break;
        iVar16 = iVar16 + 1;
      }
      if (count_p != (this->inputs).count) {
        DataChunk::Slice(this_00,chunk,&sel,count_p,0);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      iVar17 = (this->inputs).count;
    }
    p_Var5 = (pWVar1->super_WindowAggregatorGlobalState).aggr.function.simple_update;
    if (p_Var5 == (aggregate_simple_update_t)0x0) {
      *(data_ptr_t *)pdVar2 = ppdVar8[local_b8];
      pVVar6 = (this->inputs).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*(pWVar1->super_WindowAggregatorGlobalState).aggr.function.update)
                (pVVar6,&aggr_input_data,
                 ((long)(this->inputs).data.
                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pVVar6) / 0x68,&this->statep,
                 iVar17);
    }
    else {
      pVVar6 = (this->inputs).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*p_Var5)(pVVar6,&aggr_input_data,
                ((long)(this->inputs).data.
                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pVVar6) / 0x68,ppdVar8[local_b8],
                iVar17);
    }
    row_local = (end - offset) + row_local;
    offset = end;
  } while( true );
}

Assistant:

void WindowConstantAggregatorLocalState::Sink(DataChunk &sink_chunk, DataChunk &coll_chunk, idx_t row,
                                              optional_ptr<SelectionVector> filter_sel, idx_t filtered) {
	auto &partition_offsets = gstate.partition_offsets;
	const auto &aggr = gstate.aggr;
	const auto chunk_begin = row;
	const auto chunk_end = chunk_begin + sink_chunk.size();
	idx_t partition =
	    idx_t(std::upper_bound(partition_offsets.begin(), partition_offsets.end(), row) - partition_offsets.begin()) -
	    1;

	auto state_f_data = statef.GetData();
	auto state_p_data = FlatVector::GetData<data_ptr_t>(statep);

	auto &child_idx = gstate.aggregator.child_idx;
	for (column_t c = 0; c < child_idx.size(); ++c) {
		payload_chunk.data[c].Reference(sink_chunk.data[child_idx[c]]);
	}

	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	idx_t begin = 0;
	idx_t filter_idx = 0;
	auto partition_end = partition_offsets[partition + 1];
	while (row < chunk_end) {
		if (row == partition_end) {
			++partition;
			partition_end = partition_offsets[partition + 1];
		}
		partition_end = MinValue(partition_end, chunk_end);
		auto end = partition_end - chunk_begin;

		inputs.Reset();
		if (filter_sel) {
			// 	Slice to any filtered rows in [begin, end)
			SelectionVector sel;

			//	Find the first value in [begin, end)
			for (; filter_idx < filtered; ++filter_idx) {
				auto idx = filter_sel->get_index(filter_idx);
				if (idx >= begin) {
					break;
				}
			}

			//	Find the first value in [end, filtered)
			sel.Initialize(filter_sel->data() + filter_idx);
			idx_t nsel = 0;
			for (; filter_idx < filtered; ++filter_idx, ++nsel) {
				auto idx = filter_sel->get_index(filter_idx);
				if (idx >= end) {
					break;
				}
			}

			if (nsel != inputs.size()) {
				inputs.Slice(payload_chunk, sel, nsel);
			}
		} else {
			//	Slice to [begin, end)
			if (begin) {
				for (idx_t c = 0; c < payload_chunk.ColumnCount(); ++c) {
					inputs.data[c].Slice(payload_chunk.data[c], begin, end);
				}
			} else {
				inputs.Reference(payload_chunk);
			}
			inputs.SetCardinality(end - begin);
		}

		//	Aggregate the filtered rows into a single state
		const auto count = inputs.size();
		auto state = state_f_data[partition];
		if (aggr.function.simple_update) {
			aggr.function.simple_update(inputs.data.data(), aggr_input_data, inputs.ColumnCount(), state, count);
		} else {
			state_p_data[0] = state_f_data[partition];
			aggr.function.update(inputs.data.data(), aggr_input_data, inputs.ColumnCount(), statep, count);
		}

		//	Skip filtered rows too!
		row += end - begin;
		begin = end;
	}
}